

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall pbrt::QuadMesh::getBounds(box3f *__return_storage_ptr__,QuadMesh *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pvVar5;
  pointer pvVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined8 *in_RCX;
  pointer pvVar9;
  pointer pvVar10;
  QuadMesh *pQVar11;
  box3f *pbVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  if (this->haveComputedBounds == false) {
    pQVar11 = this;
    uVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (uVar8 != 0) {
      pbVar12 = (box3f *)(ulong)uVar8;
      std::__throw_system_error(uVar8);
      pvVar10 = (pQVar11->index).
                super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar6 = (pQVar11->index).
               super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (pvVar10 == pvVar6) {
        fVar16 = -3.4028235e+38;
        fVar17 = -3.4028235e+38;
        fVar18 = 3.4028235e+38;
        fVar19 = 3.4028235e+38;
        fVar15 = 3.4028235e+38;
        fVar13 = -3.4028235e+38;
      }
      else {
        fVar16 = -3.4028235e+38;
        fVar17 = -3.4028235e+38;
        fVar18 = 3.4028235e+38;
        fVar19 = 3.4028235e+38;
        fVar14 = -3.4028235e+38;
        fVar20 = 3.4028235e+38;
        do {
          fVar21 = (float)pvVar10->x;
          uVar2 = pvVar10->y;
          uVar4 = pvVar10->z;
          fVar13 = (float)uVar4 * *(float *)(in_RCX + 4) +
                   fVar21 * *(float *)(in_RCX + 1) + (float)uVar2 * *(float *)((long)in_RCX + 0x14)
                   + *(float *)((long)in_RCX + 0x2c);
          fVar15 = fVar13;
          if (fVar20 <= fVar13) {
            fVar15 = fVar20;
          }
          fVar20 = (float)uVar4 * (float)in_RCX[3] +
                   (float)uVar2 * (float)*(undefined8 *)((long)in_RCX + 0xc) +
                   fVar21 * (float)*in_RCX + (float)*(undefined8 *)((long)in_RCX + 0x24);
          fVar21 = (float)uVar4 * (float)((ulong)in_RCX[3] >> 0x20) +
                   (float)uVar2 * (float)((ulong)*(undefined8 *)((long)in_RCX + 0xc) >> 0x20) +
                   fVar21 * (float)((ulong)*in_RCX >> 0x20) +
                   (float)((ulong)*(undefined8 *)((long)in_RCX + 0x24) >> 0x20);
          fVar16 = (float)(~-(uint)(fVar16 < fVar21) & (uint)fVar16 |
                          (uint)fVar21 & -(uint)(fVar16 < fVar21));
          fVar17 = (float)(~-(uint)(fVar17 < fVar20) & (uint)fVar17 |
                          (uint)fVar20 & -(uint)(fVar17 < fVar20));
          fVar18 = (float)(~-(uint)(fVar21 < fVar18) & (uint)fVar18 |
                          (uint)fVar21 & -(uint)(fVar21 < fVar18));
          fVar19 = (float)(~-(uint)(fVar20 < fVar19) & (uint)fVar19 |
                          (uint)fVar20 & -(uint)(fVar20 < fVar19));
          if (fVar13 <= fVar14) {
            fVar13 = fVar14;
          }
          pvVar10 = (pointer)&pvVar10->w;
          fVar14 = fVar13;
          fVar20 = fVar15;
        } while (pvVar10 != pvVar6);
      }
      fVar14 = *(float *)((long)&(pQVar11->mutex).super___mutex_base._M_mutex + 0xc);
      fVar20 = *(float *)((long)&(pQVar11->mutex).super___mutex_base._M_mutex + 8);
      if (fVar14 <= fVar20) {
        fVar14 = fVar20;
      }
      (pbVar12->lower).x = fVar19 - fVar14;
      (pbVar12->lower).y = fVar18 - fVar14;
      (pbVar12->lower).z = fVar15 - fVar14;
      (pbVar12->upper).x = fVar14 + fVar17;
      (pbVar12->upper).y = fVar14 + fVar16;
      (pbVar12->upper).z = fVar14 + fVar13;
      return pbVar12;
    }
    if (this->haveComputedBounds == false) {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      pvVar9 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar5 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pvVar9 != pvVar5) {
        fVar18 = -3.4028235e+38;
        fVar19 = -3.4028235e+38;
        fVar16 = 3.4028235e+38;
        fVar17 = 3.4028235e+38;
        fVar13 = -3.4028235e+38;
        fVar15 = 3.4028235e+38;
        do {
          fVar14 = pvVar9->z;
          fVar20 = fVar14;
          if (fVar15 <= fVar14) {
            fVar20 = fVar15;
          }
          fVar15 = fVar20;
          uVar1 = pvVar9->x;
          uVar3 = pvVar9->y;
          fVar18 = (float)(~-(uint)(fVar18 < (float)uVar1) & (uint)fVar18 |
                          uVar1 & -(uint)(fVar18 < (float)uVar1));
          fVar19 = (float)(~-(uint)(fVar19 < (float)uVar3) & (uint)fVar19 |
                          uVar3 & -(uint)(fVar19 < (float)uVar3));
          fVar16 = (float)(~-(uint)((float)uVar1 < fVar16) & (uint)fVar16 |
                          uVar1 & -(uint)((float)uVar1 < fVar16));
          fVar17 = (float)(~-(uint)((float)uVar3 < fVar17) & (uint)fVar17 |
                          uVar3 & -(uint)((float)uVar3 < fVar17));
          (this->bounds).lower.z = fVar16;
          (this->bounds).upper.x = fVar17;
          (this->bounds).lower.z = fVar15;
          if (fVar14 <= fVar13) {
            fVar14 = fVar13;
          }
          fVar13 = fVar14;
          (this->bounds).upper.x = fVar18;
          (this->bounds).upper.y = fVar19;
          (this->bounds).upper.z = fVar13;
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != pvVar5);
      }
      this->haveComputedBounds = true;
    }
    fVar16 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar16;
    fVar16 = (this->bounds).lower.y;
    uVar7 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar16;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar7;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  else {
    fVar16 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar16;
    fVar16 = (this->bounds).lower.y;
    uVar7 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar16;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getBounds() 
  {
    if (!haveComputedBounds) {
      std::lock_guard<std::mutex> lock(mutex);
      if (haveComputedBounds) return bounds;
      bounds = box3f::empty_box();
      for (auto v : vertex) bounds.extend(v);
      haveComputedBounds = true;
      return bounds;
    }
    return bounds;
  }